

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropulsionSystem.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::PropulsionSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PropulsionSystem *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  PropulsionSystem *local_18;
  PropulsionSystem *this_local;
  
  local_18 = this;
  this_local = (PropulsionSystem *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Propulsion System:");
  poVar1 = std::operator<<(poVar1,"\n\tPower Setting:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PowerSetting);
  poVar1 = std::operator<<(poVar1,"\n\tEngine RPM:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32EngineRPM);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString PropulsionSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Propulsion System:"
       << "\n\tPower Setting:  " << m_f32PowerSetting
       << "\n\tEngine RPM:     " << m_f32EngineRPM
       << "\n";

    return ss.str();
}